

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jp2.c
# Opt level: O3

void opj_jp2_destroy(opj_jp2_t *jp2)

{
  OPJ_BYTE *ptr;
  opj_jp2_cdef_t *ptr_00;
  opj_jp2_pclr_t *ptr_01;
  
  if (jp2 != (opj_jp2_t *)0x0) {
    opj_j2k_destroy(jp2->j2k);
    jp2->j2k = (opj_j2k_t *)0x0;
    if (jp2->comps != (opj_jp2_comps_t *)0x0) {
      opj_free(jp2->comps);
      jp2->comps = (opj_jp2_comps_t *)0x0;
    }
    if (jp2->cl != (OPJ_UINT32 *)0x0) {
      opj_free(jp2->cl);
      jp2->cl = (OPJ_UINT32 *)0x0;
    }
    ptr = (jp2->color).icc_profile_buf;
    if (ptr != (OPJ_BYTE *)0x0) {
      opj_free(ptr);
      (jp2->color).icc_profile_buf = (OPJ_BYTE *)0x0;
    }
    ptr_00 = (jp2->color).jp2_cdef;
    if (ptr_00 != (opj_jp2_cdef_t *)0x0) {
      if (ptr_00->info != (opj_jp2_cdef_info_t *)0x0) {
        opj_free(ptr_00->info);
        ptr_00 = (jp2->color).jp2_cdef;
        ptr_00->info = (opj_jp2_cdef_info_t *)0x0;
      }
      opj_free(ptr_00);
      (jp2->color).jp2_cdef = (opj_jp2_cdef_t *)0x0;
    }
    ptr_01 = (jp2->color).jp2_pclr;
    if (ptr_01 != (opj_jp2_pclr_t *)0x0) {
      if (ptr_01->cmap != (opj_jp2_cmap_comp_t *)0x0) {
        opj_free(ptr_01->cmap);
        ptr_01 = (jp2->color).jp2_pclr;
        ptr_01->cmap = (opj_jp2_cmap_comp_t *)0x0;
      }
      if (ptr_01->channel_sign != (OPJ_BYTE *)0x0) {
        opj_free(ptr_01->channel_sign);
        ptr_01 = (jp2->color).jp2_pclr;
        ptr_01->channel_sign = (OPJ_BYTE *)0x0;
      }
      if (ptr_01->channel_size != (OPJ_BYTE *)0x0) {
        opj_free(ptr_01->channel_size);
        ptr_01 = (jp2->color).jp2_pclr;
        ptr_01->channel_size = (OPJ_BYTE *)0x0;
      }
      if (ptr_01->entries != (OPJ_UINT32 *)0x0) {
        opj_free(ptr_01->entries);
        ptr_01 = (jp2->color).jp2_pclr;
        ptr_01->entries = (OPJ_UINT32 *)0x0;
      }
      opj_free(ptr_01);
      (jp2->color).jp2_pclr = (opj_jp2_pclr_t *)0x0;
    }
    if (jp2->m_validation_list != (opj_procedure_list_t *)0x0) {
      opj_procedure_list_destroy(jp2->m_validation_list);
      jp2->m_validation_list = (opj_procedure_list *)0x0;
    }
    if (jp2->m_procedure_list != (opj_procedure_list_t *)0x0) {
      opj_procedure_list_destroy(jp2->m_procedure_list);
      jp2->m_procedure_list = (opj_procedure_list *)0x0;
    }
    opj_free(jp2);
    return;
  }
  return;
}

Assistant:

void opj_jp2_destroy(opj_jp2_t *jp2)
{
    if (jp2) {
        /* destroy the J2K codec */
        opj_j2k_destroy(jp2->j2k);
        jp2->j2k = 00;

        if (jp2->comps) {
            opj_free(jp2->comps);
            jp2->comps = 00;
        }

        if (jp2->cl) {
            opj_free(jp2->cl);
            jp2->cl = 00;
        }

        if (jp2->color.icc_profile_buf) {
            opj_free(jp2->color.icc_profile_buf);
            jp2->color.icc_profile_buf = 00;
        }

        if (jp2->color.jp2_cdef) {
            if (jp2->color.jp2_cdef->info) {
                opj_free(jp2->color.jp2_cdef->info);
                jp2->color.jp2_cdef->info = NULL;
            }

            opj_free(jp2->color.jp2_cdef);
            jp2->color.jp2_cdef = 00;
        }

        if (jp2->color.jp2_pclr) {
            if (jp2->color.jp2_pclr->cmap) {
                opj_free(jp2->color.jp2_pclr->cmap);
                jp2->color.jp2_pclr->cmap = NULL;
            }
            if (jp2->color.jp2_pclr->channel_sign) {
                opj_free(jp2->color.jp2_pclr->channel_sign);
                jp2->color.jp2_pclr->channel_sign = NULL;
            }
            if (jp2->color.jp2_pclr->channel_size) {
                opj_free(jp2->color.jp2_pclr->channel_size);
                jp2->color.jp2_pclr->channel_size = NULL;
            }
            if (jp2->color.jp2_pclr->entries) {
                opj_free(jp2->color.jp2_pclr->entries);
                jp2->color.jp2_pclr->entries = NULL;
            }

            opj_free(jp2->color.jp2_pclr);
            jp2->color.jp2_pclr = 00;
        }

        if (jp2->m_validation_list) {
            opj_procedure_list_destroy(jp2->m_validation_list);
            jp2->m_validation_list = 00;
        }

        if (jp2->m_procedure_list) {
            opj_procedure_list_destroy(jp2->m_procedure_list);
            jp2->m_procedure_list = 00;
        }

        opj_free(jp2);
    }
}